

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O2

void duckdb::PrepareSortKeys
               (DataChunk *input,
               unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
               *sort_keys,
               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *column_ids)

{
  idx_t input_count;
  _Head_base<0UL,_duckdb::Vector_*,_false> __p;
  pointer in_RAX;
  __uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *this;
  reference input_00;
  type result;
  __node_base *p_Var1;
  _Head_base<0UL,_duckdb::Vector_*,_false> local_38;
  
  p_Var1 = &(column_ids->_M_h)._M_before_begin;
  local_38._M_head_impl = in_RAX;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    this = (__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)
           ::std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)sort_keys,(key_type *)(p_Var1 + 1));
    if ((this->_M_t).super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
        super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl == (Vector *)0x0) {
      input_00 = vector<duckdb::Vector,_true>::get<true>(&input->data,(size_type)p_Var1[1]._M_nxt);
      make_uniq<duckdb::Vector,duckdb::LogicalTypeId_const&>((duckdb *)&local_38,&LogicalType::BLOB)
      ;
      __p._M_head_impl = local_38._M_head_impl;
      local_38._M_head_impl = (pointer)0x0;
      ::std::__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::reset
                (this,__p._M_head_impl);
      ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
                ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)&local_38);
      input_count = input->count;
      result = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                          this);
      CreateSortKeyHelpers::CreateSortKey(input_00,input_count,(OrderModifiers)0x302,result);
    }
  }
  return;
}

Assistant:

static void PrepareSortKeys(DataChunk &input, unordered_map<column_t, unique_ptr<Vector>> &sort_keys,
                            const unordered_set<column_t> &column_ids) {
	OrderModifiers order_modifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST);
	for (auto &it : column_ids) {
		auto &sort_key = sort_keys[it];
		if (sort_key != nullptr) {
			continue;
		}
		auto &column = input.data[it];
		sort_key = make_uniq<Vector>(LogicalType::BLOB);
		CreateSortKeyHelpers::CreateSortKey(column, input.size(), order_modifiers, *sort_key);
	}
}